

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O0

void f3(ct22 *a)

{
  __int_type _Var1;
  ostream *poVar2;
  int *in_RDI;
  rep_conflict rVar3;
  scoped_lock l_1;
  scoped_lock l;
  spin_mutex_t *in_stack_fffffffffffffef8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff00;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff08;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff10;
  duration<double,_std::ratio<1L,_1L>_> local_78 [2];
  undefined8 local_68;
  rep local_60;
  duration<double,_std::ratio<1L,_1L>_> local_58 [4];
  int *local_38;
  __atomic_base<int> local_18;
  uint local_14;
  undefined4 local_10;
  uint local_c;
  atomic<int> *local_8;
  
  local_38 = in_RDI;
  _Var1 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_ffffffffffffff08);
  local_8 = &success_counter;
  local_14 = (uint)(0x37 < _Var1);
  local_10 = 5;
  LOCK();
  UNLOCK();
  local_18 = success_counter.super___atomic_base<int>._M_i;
  inwritemode = true;
  local_c = local_14;
  success_counter.super___atomic_base<int>._M_i =
       (__atomic_base<int>)
       (__atomic_base<int>)(success_counter.super___atomic_base<int>._M_i + local_14)._M_i;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  poVar2 = std::operator<<((ostream *)&std::cerr,"-------------\nf3 ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_38);
  poVar2 = std::operator<<(poVar2," begin: ");
  local_68 = std::chrono::_V2::system_clock::now();
  local_60 = (rep)std::chrono::operator-(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff10,&in_stack_ffffffffffffff08->__d);
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_58);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x121f15);
  *local_38 = *local_38 + 1;
  fun(SUB81((ulong)rVar3 >> 0x38,0),SUB84(rVar3,0));
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  poVar2 = std::operator<<((ostream *)&std::cerr,"f3 ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_38);
  poVar2 = std::operator<<(poVar2," end: ");
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff10,&in_stack_ffffffffffffff08->__d);
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_78);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x122029);
  LOCK();
  x.super___atomic_base<int>._M_i =
       (__atomic_base<int>)(__atomic_base<int>)(x.super___atomic_base<int>._M_i + -0x38)._M_i;
  UNLOCK();
  inwritemode = false;
  return;
}

Assistant:

void f3(ct22& a)
{ 
  success_counter.fetch_add(x >= (32 + 16 + 8)); //f2, f2b and f2c must have finished
  inwritemode = true;
  LOG("-------------\nf3 " << a[0] << " begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  a[0]++;
  fun(false);
  LOG("f3 " << a[0] << " end: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  inwritemode = false;
  x.fetch_add(-(32 + 16 + 8));
}